

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

QualifiedName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
          (Db *this,Node **args,Node **args_1)

{
  Node *pNVar1;
  Node *pNVar2;
  QualifiedName *pQVar3;
  
  pQVar3 = (QualifiedName *)
           anon_unknown.dwarf_3a70a8::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  pNVar1 = *args;
  pNVar2 = *args_1;
  (pQVar3->super_Node).K = KQualifiedName;
  (pQVar3->super_Node).RHSComponentCache = No;
  (pQVar3->super_Node).ArrayCache = No;
  (pQVar3->super_Node).FunctionCache = No;
  (pQVar3->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001ded30;
  pQVar3->Qualifier = pNVar1;
  pQVar3->Name = pNVar2;
  return pQVar3;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }